

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token)

{
  Location pCVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  ValueHolder VVar4;
  Value *pVVar5;
  Location pCVar6;
  bool bVar7;
  _Elt_pointer ppVVar8;
  undefined1 auVar9 [16];
  ValueHolder local_40;
  ushort local_38;
  undefined1 local_30 [16];
  undefined8 local_20;
  
  local_38 = 0;
  local_30 = (undefined1  [16])0x0;
  local_20 = 0;
  bVar7 = decodeDouble(this,token,(Value *)&local_40);
  if (bVar7) {
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar3 = &ppVVar8[-1]->value_;
    uVar2 = *(ushort *)(pVVar3 + 1);
    VVar4 = *pVVar3;
    *pVVar3 = local_40;
    *(ushort *)(pVVar3 + 1) = local_38 & 0x1ff | uVar2 & 0xfe00;
    local_38 = uVar2 & 0x1ff | local_38 & 0xfe00;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar8 = ppVVar8 + -1;
    }
    pVVar5 = *ppVVar8;
    pCVar6 = token->end_;
    pCVar1 = this->begin_;
    auVar9._8_4_ = (int)pCVar1;
    auVar9._0_8_ = pCVar1;
    auVar9._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar5->start_ = (long)token->start_ - (long)pCVar1;
    pVVar5->limit_ = (long)pCVar6 - auVar9._8_8_;
    local_40 = VVar4;
  }
  Value::~Value((Value *)&local_40);
  return bVar7;
}

Assistant:

bool OurReader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}